

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::BasicWriter<wchar_t>::write_str<char>
          (BasicWriter<wchar_t> *this,StringValue<char> *s,FormatSpec *spec)

{
  char code;
  ulong uVar1;
  FormatError *this_00;
  ulong size;
  ulong uVar2;
  
  code = spec->type_;
  if ((code != '\0') && (code != 's')) {
    internal::report_unknown_type(code,"string");
  }
  uVar1 = s->size;
  if (uVar1 != 0 || s->value != (char *)0x0) {
    uVar2 = (ulong)spec->precision_;
    size = uVar2;
    if (uVar1 < uVar2) {
      size = uVar1;
    }
    if ((long)uVar2 < 0) {
      size = uVar1;
    }
    write_str<char>(this,s->value,size,&spec->super_AlignSpec);
    return;
  }
  this_00 = (FormatError *)__cxa_allocate_exception(0x10);
  FormatError::FormatError(this_00,(CStringRef)0x1312f1);
  __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
}

Assistant:

void BasicWriter<Char>::write_str(
    const internal::Arg::StringValue<StrChar> &s, const FormatSpec &spec) {
  // Check if StrChar is convertible to Char.
  internal::CharTraits<Char>::convert(StrChar());
  if (spec.type_ && spec.type_ != 's')
    internal::report_unknown_type(spec.type_, "string");
  const StrChar *str_value = s.value;
  std::size_t str_size = s.size;
  if (str_size == 0) {
    if (!str_value) {
      FMT_THROW(FormatError("string pointer is null"));
    }
  }
  std::size_t precision = static_cast<std::size_t>(spec.precision_);
  if (spec.precision_ >= 0 && precision < str_size)
    str_size = precision;
  write_str(str_value, str_size, spec);
}